

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * httplib::detail::encode_query_param(string *__return_storage_ptr__,string *value)

{
  uint *puVar1;
  byte bVar2;
  long lVar3;
  size_type sVar4;
  pointer pcVar5;
  string *psVar6;
  char cVar7;
  int iVar8;
  ostream *this;
  size_type sVar9;
  uint uVar10;
  ostringstream escaped;
  undefined1 auStack_1b8 [7];
  byte local_1b1;
  string *local_1b0;
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  lVar3 = *(long *)(local_1a8[0] + -0x18);
  if (acStack_c8[lVar3 + 1] == '\0') {
    cVar7 = std::ios::widen((char)auStack_1b8 + (char)lVar3 + '\x10');
    acStack_c8[lVar3] = cVar7;
    acStack_c8[lVar3 + 1] = '\x01';
  }
  acStack_c8[lVar3] = '0';
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
  sVar4 = value->_M_string_length;
  local_1b0 = __return_storage_ptr__;
  if (sVar4 != 0) {
    pcVar5 = (value->_M_dataplus)._M_p;
    sVar9 = 0;
    do {
      bVar2 = pcVar5[sVar9];
      uVar10 = (uint)bVar2;
      iVar8 = isalnum(uVar10);
      if ((iVar8 == 0) &&
         (((0x3e < uVar10 - 0x21 ||
           ((0x40000000000033c1U >> ((ulong)(uVar10 - 0x21) & 0x3f) & 1) == 0)) && (bVar2 != 0x7e)))
         ) {
        puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
        *puVar1 = *puVar1 | 0x4000;
        local_1b1 = 0x25;
        this = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)&local_1b1,1);
        *(undefined8 *)(this + *(long *)(*(long *)this + -0x18) + 0x10) = 2;
        std::ostream::operator<<(this,uVar10);
        puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
        *puVar1 = *puVar1 & 0xffffbfff;
      }
      else {
        local_1b1 = bVar2;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1b1,1);
      }
      sVar9 = sVar9 + 1;
    } while (sVar4 != sVar9);
  }
  psVar6 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar6;
}

Assistant:

inline std::string encode_query_param(const std::string &value) {
  std::ostringstream escaped;
  escaped.fill('0');
  escaped << std::hex;

  for (auto c : value) {
    if (std::isalnum(static_cast<uint8_t>(c)) || c == '-' || c == '_' ||
        c == '.' || c == '!' || c == '~' || c == '*' || c == '\'' || c == '(' ||
        c == ')') {
      escaped << c;
    } else {
      escaped << std::uppercase;
      escaped << '%' << std::setw(2)
              << static_cast<int>(static_cast<unsigned char>(c));
      escaped << std::nouppercase;
    }
  }

  return escaped.str();
}